

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

bool libcellml::AnalyserInternalEquation::isNonConstantVariable
               (AnalyserInternalVariablePtr *variable)

{
  element_type *peVar1;
  bool local_12;
  bool local_11;
  AnalyserInternalVariablePtr *variable_local;
  
  peVar1 = std::
           __shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)variable);
  local_11 = true;
  if ((peVar1->mIsExternal & 1U) == 0) {
    peVar1 = std::
             __shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
    local_12 = false;
    if (peVar1->mType != UNKNOWN) {
      peVar1 = std::
               __shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)variable);
      local_12 = false;
      if (peVar1->mType != INITIALISED) {
        peVar1 = std::
                 __shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)variable);
        local_12 = false;
        if (peVar1->mType != COMPUTED_TRUE_CONSTANT) {
          peVar1 = std::
                   __shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnalyserInternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)variable);
          local_12 = peVar1->mType != COMPUTED_VARIABLE_BASED_CONSTANT;
        }
      }
    }
    local_11 = local_12;
  }
  return local_11;
}

Assistant:

bool AnalyserInternalEquation::isNonConstantVariable(const AnalyserInternalVariablePtr &variable)
{
    // Note: we don't check for AnalyserInternalVariable::Type::CONSTANT because
    //       a variable's type becomes constant at the very end, i.e. once we
    //       know for sure that it's neither a state variable nor a variable
    //       that is computed using an NLA system.

    return variable->mIsExternal
           || ((variable->mType != AnalyserInternalVariable::Type::UNKNOWN)
               && (variable->mType != AnalyserInternalVariable::Type::INITIALISED)
               && (variable->mType != AnalyserInternalVariable::Type::COMPUTED_TRUE_CONSTANT)
               && (variable->mType != AnalyserInternalVariable::Type::COMPUTED_VARIABLE_BASED_CONSTANT));
}